

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<unsigned_long,unsigned_long,duckdb::GreaterThanEquals,true,false,true,true>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = 0;
  lVar8 = 0;
  iVar3 = 0;
  uVar9 = 0;
  do {
    if (uVar5 == count + 0x3f >> 6) {
      return iVar3;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar7 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar7 = count;
      }
LAB_003ce312:
      while (uVar10 = uVar9, uVar10 < uVar7) {
        uVar9 = uVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar10];
        }
        uVar2 = rdata[uVar10];
        uVar6 = *ldata;
        true_sel->sel_vector[iVar3] = (sel_t)uVar9;
        iVar3 = iVar3 + (uVar2 <= uVar6);
        false_sel->sel_vector[lVar8] = (sel_t)uVar9;
        lVar8 = lVar8 + (ulong)(uVar6 < uVar2);
        uVar9 = uVar10 + 1;
      }
    }
    else {
      uVar2 = puVar1[uVar5];
      uVar10 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar10 = count;
      }
      uVar7 = uVar10;
      if (uVar2 == 0xffffffffffffffff) goto LAB_003ce312;
      if (uVar2 == 0) {
        for (; uVar9 < uVar10; uVar9 = uVar9 + 1) {
          uVar7 = uVar9;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)sel->sel_vector[uVar9];
          }
          false_sel->sel_vector[lVar8] = (sel_t)uVar7;
          lVar8 = lVar8 + 1;
        }
      }
      else {
        for (uVar7 = 0; uVar6 = uVar9 + uVar7, uVar6 < uVar10; uVar7 = uVar7 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)sel->sel_vector[uVar9 + uVar7];
          }
          if ((uVar2 >> (uVar7 & 0x3f) & 1) == 0) {
            bVar4 = false;
          }
          else {
            bVar4 = rdata[uVar9 + uVar7] <= *ldata;
          }
          true_sel->sel_vector[iVar3] = (sel_t)uVar6;
          iVar3 = iVar3 + bVar4;
          false_sel->sel_vector[lVar8] = (sel_t)uVar6;
          lVar8 = lVar8 + (ulong)(bVar4 ^ 1);
        }
        uVar10 = uVar9 + uVar7;
      }
    }
    uVar5 = uVar5 + 1;
    uVar9 = uVar10;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}